

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qr.c
# Opt level: O2

void qrPower(word *c,word *a,word *b,size_t m,qr_o *r,void *stack)

{
  word *b_00;
  word *pwVar1;
  byte bVar2;
  bool_t bVar3;
  size_t sVar4;
  size_t sVar5;
  word wVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  
  sVar4 = qrCalcSlideWidth(m);
  bVar2 = (char)sVar4 - 1;
  sVar8 = r->n;
  bVar3 = wwIsZero(b,m);
  if (bVar3 == 0) {
    b_00 = (word *)((long)stack + sVar8 * 8);
    pwVar1 = b_00 + (sVar8 << (bVar2 & 0x3f));
    (*r->sqr)(b_00,a,r,pwVar1);
    (*r->mul)(b_00 + r->n,a,b_00,r,pwVar1);
    for (uVar7 = 2; uVar7 >> (bVar2 & 0x3f) == 0; uVar7 = uVar7 + 1) {
      (*r->mul)(b_00 + r->n * uVar7,b_00 + r->n * uVar7 + -r->n,b_00,r,pwVar1);
    }
    wwCopy(b_00,a,r->n);
    sVar5 = wwBitSize(b,m);
    sVar8 = sVar4;
    if (sVar5 < sVar4) {
      sVar8 = sVar5;
    }
    uVar7 = wwGetBits(b,sVar5 - sVar8,sVar8);
    sVar8 = (sVar5 - sVar8) - 1;
    for (; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1) {
      sVar8 = sVar8 + 1;
    }
    wwCopy((word *)stack,b_00 + (uVar7 >> 1) * r->n,r->n);
    while (sVar8 != 0xffffffffffffffff) {
      bVar3 = wwTestBit(b,sVar8);
      if (bVar3 == 0) {
        (*r->sqr)((word *)stack,(word *)stack,r,pwVar1);
        sVar8 = sVar8 - 1;
      }
      else {
        uVar7 = sVar8 + 1;
        sVar5 = sVar4;
        if (uVar7 < sVar4) {
          sVar5 = uVar7;
        }
        for (wVar6 = wwGetBits(b,uVar7 - sVar5,sVar5); (wVar6 & 1) == 0; wVar6 = wVar6 >> 1) {
          sVar5 = sVar5 - 1;
        }
        for (sVar9 = 0; sVar5 != sVar9; sVar9 = sVar9 + 1) {
          (*r->sqr)((word *)stack,(word *)stack,r,pwVar1);
        }
        sVar8 = sVar8 - sVar5;
        (*r->mul)((word *)stack,(word *)stack,b_00 + (wVar6 >> 1) * r->n,r,pwVar1);
      }
    }
  }
  else {
    stack = r->unity;
  }
  wwCopy(c,(word *)stack,r->n);
  return;
}

Assistant:

void qrPower(word c[], const word a[], const word b[], size_t m, 
	const qr_o* r, void* stack)
{
	const size_t w = qrCalcSlideWidth(m);
	const size_t powers_count = SIZE_1 << (w - 1);
	register word slide;
	register size_t slide_size;
	size_t pos;
	// переменные в stack
	word* power;
	word* powers;
	// pre
	ASSERT(qrIsOperable(r));
	ASSERT(wwIsValid(a, r->n));
	ASSERT(wwIsValid(b, m));
	ASSERT(wwIsValid(c, r->n));
	// раскладка stack
	power = (word*)stack;
	powers = power + r->n;
	stack = powers + r->n * powers_count;
	// b == 0? => с <- unity
	if (wwIsZero(b, m))
	{
		wwCopy(c, r->unity, r->n);
		return;
	}
	// расчет малых степеней a
	ASSERT(w > 0);
	if (w == 1)
		wwCopy(powers, a, r->n);
	else
	{
		size_t i;
		// powers[0] <- a^2
		qrSqr(powers, a, r, stack);
		// powers[1] <- a^3
		qrMul(powers + r->n, a, powers, r, stack);
		// powers[i] <- a^{2i + 1} = powers[i - 1] * powers[0]
		for (i = 2; i < powers_count; ++i)
			qrMul(powers + r->n * i, powers + r->n * i - r->n, powers, r, 
				stack);
		// powers[0] <- a
		wwCopy(powers, a, r->n);
	}
	// pos <- l - 1
	pos = wwBitSize(b, m) - 1;
	ASSERT(pos != SIZE_MAX);
	// slide <- старший слайд b
	slide_size = MIN2(pos + 1, w);
	slide = wwGetBits(b, pos - slide_size + 1, slide_size);
	while (slide % 2 == 0)
		slide >>= 1, slide_size--;
	// power <- powers[slide / 2]
	wwCopy(power, powers + r->n * (slide / 2), r->n);
	pos -= slide_size;
	// пробегаем биты b
	while (pos != SIZE_MAX)
		if (!wwTestBit(b, pos))
		{
			// power <- power^2
			qrSqr(power, power, r, stack);
			--pos;
		}
		else
		{
			// slide <- очередной слайд b
			slide_size = MIN2(pos + 1, w);
			slide = wwGetBits(b, pos - slide_size + 1, slide_size);
			while (slide % 2 == 0)
				slide >>= 1, slide_size--;
			pos -= slide_size;
			// power <- power^2
			while (slide_size--)
				qrSqr(power, power, r, stack);
			// power <- power * powers[slide / 2]
			qrMul(power, power, powers + r->n * (slide / 2), r, stack);
		}
	// очистка и возврат
	slide_size = 0, slide = 0;
	wwCopy(c, power, r->n);
}